

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.cpp
# Opt level: O2

void __thiscall aeron::Subscription::~Subscription(Subscription *this)

{
  this->_vptr_Subscription = (_func_int **)&PTR__Subscription_00170ce0;
  ClientConductor::releaseSubscription
            (this->m_conductor,this->m_registrationId,(this->m_imageList)._M_b._M_p);
  std::__cxx11::string::~string((string *)&this->m_channel);
  return;
}

Assistant:

Subscription::~Subscription()
{
    m_conductor.releaseSubscription(m_registrationId, std::atomic_load_explicit(&m_imageList, std::memory_order_acquire));
}